

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogCompare.cpp
# Opt level: O0

void computeCaseList(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *cases,vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>
                            *batchResults)

{
  bool bVar1;
  pointer pSVar2;
  pointer pTVar3;
  _Self local_88 [3];
  _Self local_70;
  __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
  local_68;
  __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
  local_60;
  const_iterator caseIter;
  __normal_iterator<const_ShortBatchResult_*,_std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>_>
  local_50;
  const_iterator batchIter;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedCases;
  vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> *batchResults_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cases_local;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&batchIter);
  local_50._M_current =
       (ShortBatchResult *)
       std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>::begin(batchResults);
  while( true ) {
    caseIter._M_current =
         (TestCaseResultHeader *)
         std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>::end(batchResults);
    bVar1 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<const_ShortBatchResult_*,_std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>_>
                        *)&caseIter);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_ShortBatchResult_*,_std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>_>
             ::operator->(&local_50);
    local_60._M_current =
         (TestCaseResultHeader *)
         std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::begin
                   (&pSVar2->resultHeaders);
    while( true ) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<const_ShortBatchResult_*,_std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>_>
               ::operator->(&local_50);
      local_68._M_current =
           (TestCaseResultHeader *)
           std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::end
                     (&pSVar2->resultHeaders);
      bVar1 = __gnu_cxx::operator!=(&local_60,&local_68);
      if (!bVar1) break;
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
               ::operator->(&local_60);
      local_70._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&batchIter,&pTVar3->casePath);
      local_88[0]._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&batchIter);
      bVar1 = std::operator==(&local_70,local_88);
      if (bVar1) {
        pTVar3 = __gnu_cxx::
                 __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
                 ::operator->(&local_60);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(cases,&pTVar3->casePath);
        pTVar3 = __gnu_cxx::
                 __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
                 ::operator->(&local_60);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&batchIter,&pTVar3->casePath);
      }
      __gnu_cxx::
      __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
      ::operator++(&local_60,0);
    }
    __gnu_cxx::
    __normal_iterator<const_ShortBatchResult_*,_std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>_>
    ::operator++(&local_50,0);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&batchIter);
  return;
}

Assistant:

static void computeCaseList (vector<string>& cases, const vector<ShortBatchResult>& batchResults)
{
	// \todo [2012-07-10 pyry] Do proper case ordering (eg. handle missing cases nicely).
	set<string> addedCases;

	for (vector<ShortBatchResult>::const_iterator batchIter = batchResults.begin(); batchIter != batchResults.end(); batchIter++)
	{
		for (vector<xe::TestCaseResultHeader>::const_iterator caseIter = batchIter->resultHeaders.begin(); caseIter != batchIter->resultHeaders.end(); caseIter++)
		{
			if (addedCases.find(caseIter->casePath) == addedCases.end())
			{
				cases.push_back(caseIter->casePath);
				addedCases.insert(caseIter->casePath);
			}
		}
	}
}